

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_import(JSParseState *s,JSModuleDef *m,JSAtom local_name,JSAtom import_name)

{
  int iVar1;
  uint var_idx_00;
  int iVar2;
  JSAtom JVar3;
  int *piVar4;
  int in_ECX;
  JSAtom in_EDX;
  long in_RSI;
  JSParseState *in_RDI;
  JSVarKindEnum unaff_retaddr;
  BOOL is_local;
  JSImportEntry *mi;
  int var_idx;
  int i;
  JSContext *ctx;
  int in_stack_ffffffffffffffac;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  JSAtom in_stack_ffffffffffffffbc;
  JSAtom in_stack_ffffffffffffffc0;
  JSContext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  BOOL in_stack_fffffffffffffff8;
  int local_4;
  
  if ((in_EDX == 0x4d) || (in_EDX == 0x3a)) {
    local_4 = js_parse_error(in_RDI,"invalid import binding");
  }
  else {
    if (in_EDX != 0x16) {
      for (in_stack_ffffffffffffffd4 = 0;
          in_stack_ffffffffffffffd4 < in_RDI->cur_func->closure_var_count;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        if (in_RDI->cur_func->closure_var[in_stack_ffffffffffffffd4].var_name == in_EDX) {
          iVar1 = js_parse_error(in_RDI,"duplicate import binding");
          return iVar1;
        }
      }
    }
    var_idx_00 = (uint)(in_ECX == 0x7d);
    uVar5 = 1;
    iVar1 = add_closure_var(in_RDI->ctx,
                            (JSFunctionDef *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (BOOL)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                            (BOOL)in_stack_ffffffffffffffc8,var_idx_00,in_stack_ffffffffffffffc0,
                            (BOOL)in_RDI,in_stack_fffffffffffffff8,unaff_retaddr);
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      iVar2 = js_resize_array(in_stack_ffffffffffffffc8,
                              (void **)CONCAT44(var_idx_00,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc,
                              (int *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),
                              in_stack_ffffffffffffffac);
      if (iVar2 == 0) {
        iVar2 = *(int *)(in_RSI + 0x50);
        *(int *)(in_RSI + 0x50) = iVar2 + 1;
        piVar4 = (int *)(*(long *)(in_RSI + 0x48) + (long)iVar2 * 0xc);
        JVar3 = JS_DupAtom((JSContext *)CONCAT44(var_idx_00,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
        piVar4[1] = JVar3;
        *piVar4 = iVar1;
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

static int add_import(JSParseState *s, JSModuleDef *m,
                      JSAtom local_name, JSAtom import_name)
{
    JSContext *ctx = s->ctx;
    int i, var_idx;
    JSImportEntry *mi;
    BOOL is_local;

    if (local_name == JS_ATOM_arguments || local_name == JS_ATOM_eval)
        return js_parse_error(s, "invalid import binding");

    if (local_name != JS_ATOM_default) {
        for (i = 0; i < s->cur_func->closure_var_count; i++) {
            if (s->cur_func->closure_var[i].var_name == local_name)
                return js_parse_error(s, "duplicate import binding");
        }
    }

    is_local = (import_name == JS_ATOM__star_);
    var_idx = add_closure_var(ctx, s->cur_func, is_local, FALSE,
                              m->import_entries_count,
                              local_name, TRUE, TRUE, FALSE);
    if (var_idx < 0)
        return -1;
    if (js_resize_array(ctx, (void **)&m->import_entries,
                        sizeof(JSImportEntry),
                        &m->import_entries_size,
                        m->import_entries_count + 1))
        return -1;
    mi = &m->import_entries[m->import_entries_count++];
    mi->import_name = JS_DupAtom(ctx, import_name);
    mi->var_idx = var_idx;
    return 0;
}